

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O2

void QtPrivate::q_uninitialized_relocate_n<QPropertyBindingPrivatePtr,long_long>
               (QPropertyBindingPrivatePtr *first,longlong n,QPropertyBindingPrivatePtr *out)

{
  std::
  __uninitialized_copy_n_pair<std::move_iterator<QPropertyBindingPrivatePtr*>,long_long,QPropertyBindingPrivatePtr*>
            ();
  std::_Destroy_n_aux<false>::__destroy_n<QPropertyBindingPrivatePtr*,long_long>(first,n);
  return;
}

Assistant:

void q_uninitialized_relocate_n(T* first, N n, T* out)
{
    if constexpr (QTypeInfo<T>::isRelocatable) {
        static_assert(std::is_copy_constructible_v<T> || std::is_move_constructible_v<T>,
                      "Refusing to relocate this non-copy/non-move-constructible type.");
        if (n != N(0)) { // even if N == 0, out == nullptr or first == nullptr are UB for memcpy()
            std::memcpy(static_cast<void *>(out),
                        static_cast<const void *>(first),
                        n * sizeof(T));
        }
    } else {
        q_uninitialized_move_if_noexcept_n(first, n, out);
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(first, n);
    }
}